

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

QList<QGraphicsObject_*> * __thiscall QSet<QGraphicsObject_*>::values(QSet<QGraphicsObject_*> *this)

{
  long lVar1;
  bool bVar2;
  QSet<QGraphicsObject_*> *in_RSI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000018;
  QList<QGraphicsObject_*> *result;
  const_iterator i;
  parameter_type this_00;
  QList<QGraphicsObject_*> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->super_QGraphicsItem)._vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QGraphicsObject_*>::QList((QList<QGraphicsObject_*> *)0x9e1e10);
  size((QSet<QGraphicsObject_*> *)0x9e1e1a);
  QList<QGraphicsObject_*>::reserve(in_stack_ffffffffffffffd8,in_stack_00000018);
  constBegin(in_RSI);
  while( true ) {
    constEnd(in_RSI);
    bVar2 = const_iterator::operator!=((const_iterator *)this_00,(const_iterator *)in_RDI);
    if (!bVar2) break;
    const_iterator::operator*((const_iterator *)0x9e1e7c);
    QList<QGraphicsObject_*>::append((QList<QGraphicsObject_*> *)0x9e1e89,in_RDI);
    const_iterator::operator++((const_iterator *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QGraphicsObject_*> *)in_RDI;
}

Assistant:

Q_OUTOFLINE_TEMPLATE QList<T> QSet<T>::values() const
{
    QList<T> result;
    result.reserve(size());
    typename QSet<T>::const_iterator i = constBegin();
    while (i != constEnd()) {
        result.append(*i);
        ++i;
    }
    return result;
}